

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool operator<(ON_wString *lhs,wchar_t *rhs)

{
  int iVar1;
  wchar_t *string1;
  int rc;
  wchar_t *rhs_local;
  ON_wString *lhs_local;
  
  string1 = ON_wString::operator_cast_to_wchar_t_(lhs);
  iVar1 = ON_wString::Length(lhs);
  iVar1 = ON_wString::CompareOrdinal(string1,iVar1,rhs,-1,false);
  return iVar1 < 0;
}

Assistant:

bool operator<( const ON_wString& lhs, const wchar_t* rhs )
{
  const int rc = ON_wString::CompareOrdinal(
    static_cast<const wchar_t*>(lhs),
    lhs.Length(),
    rhs,
    -1,
    false
    );
  return (rc < 0);
}